

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall
V2Chan::accumulate(V2Chan *this,StereoSample *dest,StereoSample *src,int nsamples,float gain)

{
  ulong uVar1;
  ulong uVar2;
  
  if ((gain != 0.0) || (NAN(gain))) {
    uVar1 = 0;
    uVar2 = (ulong)(uint)nsamples;
    if (nsamples < 1) {
      uVar2 = uVar1;
    }
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      dest[uVar1].field_0.l = src[uVar1].field_0.l * gain + dest[uVar1].field_0.l;
      *(float *)((long)dest + uVar1 * 8 + 4) =
           *(float *)((long)src + uVar1 * 8 + 4) * gain + *(float *)((long)dest + uVar1 * 8 + 4);
    }
  }
  return;
}

Assistant:

void accumulate(StereoSample *dest, const StereoSample *src, int nsamples, float gain)
    {
        if (gain == 0.0f)
            return;

        for (int i = 0; i < nsamples; i++)
        {
            dest[i].l += gain * src[i].l;
            dest[i].r += gain * src[i].r;
        }
    }